

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Generator.h
# Opt level: O3

void cppqc::detail::TupleGeneratorHelper_shrink<0,Rectangle>::
     appendShrinks<std::tuple<cppqc::Generator<Rectangle>>>
               (tuple<Rectangle> *shrinkInput,
               vector<std::tuple<Rectangle>,_std::allocator<std::tuple<Rectangle>_>_> *shrinkOutput,
               tuple<cppqc::Generator<Rectangle>_> *generators)

{
  pointer *pptVar1;
  __uniq_ptr_impl<cppqc::detail::GenConcept<Rectangle>,_std::default_delete<cppqc::detail::GenConcept<Rectangle>_>_>
  _Var2;
  iterator __position;
  Rectangle *localShrink;
  Rectangle *pRVar3;
  vector<Rectangle,_std::allocator<Rectangle>_> allLocalShrinks;
  Rectangle local_40;
  Rectangle *local_38;
  Rectangle *local_30;
  
  _Var2._M_t.
  super__Tuple_impl<0UL,_cppqc::detail::GenConcept<Rectangle>_*,_std::default_delete<cppqc::detail::GenConcept<Rectangle>_>_>
  .super__Head_base<0UL,_cppqc::detail::GenConcept<Rectangle>_*,_false>._M_head_impl =
       (generators->super__Tuple_impl<0UL,_cppqc::Generator<Rectangle>_>).
       super__Head_base<0UL,_cppqc::Generator<Rectangle>,_false>._M_head_impl.m_gen._M_t.
       super___uniq_ptr_impl<cppqc::detail::GenConcept<Rectangle>,_std::default_delete<cppqc::detail::GenConcept<Rectangle>_>_>
       ._M_t;
  (**(code **)(*(long *)_Var2._M_t.
                        super__Tuple_impl<0UL,_cppqc::detail::GenConcept<Rectangle>_*,_std::default_delete<cppqc::detail::GenConcept<Rectangle>_>_>
                        .super__Head_base<0UL,_cppqc::detail::GenConcept<Rectangle>_*,_false>.
                        _M_head_impl + 0x18))
            (&local_38,
             _Var2._M_t.
             super__Tuple_impl<0UL,_cppqc::detail::GenConcept<Rectangle>_*,_std::default_delete<cppqc::detail::GenConcept<Rectangle>_>_>
             .super__Head_base<0UL,_cppqc::detail::GenConcept<Rectangle>_*,_false>._M_head_impl,
             shrinkInput);
  if (local_38 != local_30) {
    pRVar3 = local_38;
    do {
      local_40 = *pRVar3;
      __position._M_current =
           (shrinkOutput->
           super__Vector_base<std::tuple<Rectangle>,_std::allocator<std::tuple<Rectangle>_>_>).
           _M_impl.super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (shrinkOutput->
          super__Vector_base<std::tuple<Rectangle>,_std::allocator<std::tuple<Rectangle>_>_>).
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<std::tuple<Rectangle>,std::allocator<std::tuple<Rectangle>>>::
        _M_realloc_insert<std::tuple<Rectangle>>
                  ((vector<std::tuple<Rectangle>,std::allocator<std::tuple<Rectangle>>> *)
                   shrinkOutput,__position,(tuple<Rectangle> *)&local_40);
      }
      else {
        ((__position._M_current)->super__Tuple_impl<0UL,_Rectangle>).
        super__Head_base<0UL,_Rectangle,_false>._M_head_impl = local_40;
        pptVar1 = &(shrinkOutput->
                   super__Vector_base<std::tuple<Rectangle>,_std::allocator<std::tuple<Rectangle>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish;
        *pptVar1 = *pptVar1 + 1;
      }
      pRVar3 = pRVar3 + 1;
    } while (pRVar3 != local_30);
  }
  if (local_38 != (Rectangle *)0x0) {
    operator_delete(local_38);
  }
  return;
}

Assistant:

static void appendShrinks(const std::tuple<T...>& shrinkInput,
                            std::vector<std::tuple<T...>>& shrinkOutput,
                            const Generators& generators) {
    // Compute all shrink combinations for the tuple
    // element at the position "offset".
    // All other elements will not be changed.
    static_assert(offset >= 0 && offset < sizeof...(T), "offset out of bounds");
    auto allLocalShrinks =
        std::get<offset>(generators).shrink(std::get<offset>(shrinkInput));
    for (auto&& localShrink : allLocalShrinks) {
      auto copiedShrinkInput = shrinkInput;
      std::get<offset>(copiedShrinkInput) = std::move(localShrink);
      shrinkOutput.push_back(std::move(copiedShrinkInput));
    }

    // continue recursion (from right to left)
    TupleGeneratorHelper_shrink<offset - 1, T...>::appendShrinks(
        shrinkInput, shrinkOutput, generators);
  }